

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_util.cc
# Opt level: O2

bool DoSplitHandshake(UniquePtr<SSL> *ssl,SettingsWriter *writer,bool is_resume)

{
  SSL *pSVar1;
  BIO *pBVar2;
  Span<const_unsigned_char> handback_00;
  ScopedFD fd;
  UniquePtr<SSL> UVar3;
  pointer in;
  pointer puVar4;
  bool bVar5;
  bool bVar6;
  uint __i;
  int iVar7;
  uint uVar8;
  BIO *pBVar9;
  BIO *pBVar10;
  TestConfig *config;
  TestConfig *pTVar11;
  uint8_t *puVar12;
  size_t sVar13;
  SSL_CTX *pSVar14;
  TestState *pTVar15;
  uint8_t *puVar16;
  ssize_t sVar17;
  long lVar18;
  size_type __new_size;
  ScopedFD SVar19;
  char *pcVar20;
  ulong uVar21;
  CBS *data;
  Span<const_unsigned_char> handoff;
  initializer_list<std::pair<const_int,_int>_> __l;
  initializer_list<int> __l_00;
  Span<const_unsigned_char> handback_01;
  size_t sStack_270;
  char msg;
  bool local_25d;
  ScopedFD control;
  ScopedProcess handshaker;
  ScopedFD rfd0_closer;
  ScopedFD wfd1_closer;
  ScopedFD rfd1_closer;
  ScopedFD wfd0_closer;
  int rfd [2];
  undefined1 local_228 [8];
  BIO *local_220;
  int wfd [2];
  uint8_t header [5];
  int local_1f4;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_1f0;
  ulong local_1e8;
  pointer local_1e0;
  pointer local_1d8;
  __uniq_ptr_impl<TestState,_std::default_delete<TestState>_> local_1d0;
  CBS handback;
  UniquePtr<SSL> ssl_handback;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> handshaker_input;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_110;
  anon_class_24_3_c17cc0e2 proxy_data;
  _Vector_base<int,_std::allocator<int>_> local_c8;
  CBS output;
  
  local_1f0._M_head_impl = (evp_pkey_st *)writer;
  pBVar9 = SSL_get_rbio((SSL *)(ssl->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                               _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  pBVar10 = SSL_get_wbio((SSL *)(ssl->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  if (pBVar9 != pBVar10) {
    __assert_fail("SSL_get_rbio(ssl->get()) == SSL_get_wbio(ssl->get())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/handshake_util.cc"
                  ,0x29e,"bool DoSplitHandshake(UniquePtr<SSL> *, SettingsWriter *, bool)");
  }
  handshaker_input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  handshaker_input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  handshaker_input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  config = GetTestConfig((ssl->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar1 = (SSL *)(ssl->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl;
  local_110._M_impl._0_8_ = pSVar1;
  bssl::SSL_set_handoff_mode((SSL *)pSVar1,true);
  pTVar11 = GetTestConfig((SSL *)pSVar1);
  do {
    ssl_handback._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>
    ._M_head_impl = (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)&local_110;
    iVar7 = CheckIdempotentError
                      ("SSL_do_handshake",(SSL *)local_110._M_impl._0_8_,
                       (function<int_()> *)&ssl_handback);
    std::_Function_base::~_Function_base((_Function_base *)&ssl_handback);
    bVar5 = HandoffReady((SSL *)local_110._M_impl._0_8_,iVar7);
    if ((bVar5) || (pTVar11->async != true)) break;
    bVar5 = RetryAsync((SSL *)local_110._M_impl._0_8_,iVar7);
  } while (bVar5);
  bVar5 = HandoffReady((SSL *)local_110._M_impl._0_8_,iVar7);
  if (!bVar5) {
    fwrite("Handshake failed while waiting for handoff.\n",0x2c,1,_stderr);
    goto LAB_0011e6bc;
  }
  CBB_zero((CBB *)&handback);
  iVar7 = CBB_init((CBB *)&handback,0x200);
  if ((iVar7 == 0) ||
     (bVar5 = bssl::SSL_serialize_handoff
                        ((SSL *)local_110._M_impl._0_8_,(CBB *)&handback,(SSL_CLIENT_HELLO *)&output
                        ), !bVar5)) {
LAB_0011e693:
    fwrite("Handoff serialisation failed.\n",0x1e,1,_stderr);
    bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&handback);
  }
  else {
    puVar12 = CBB_data((CBB *)&handback);
    sVar13 = CBB_len((CBB *)&handback);
    handoff.size_ = sVar13;
    handoff.data_ = puVar12;
    bVar5 = SettingsWriter::WriteHandoff((SettingsWriter *)local_1f0._M_head_impl,handoff);
    if (!bVar5) goto LAB_0011e693;
    pSVar14 = (SSL_CTX *)SSL_get_SSL_CTX((SSL *)local_110._M_impl._0_8_);
    bVar5 = SerializeContextState(pSVar14,(CBB *)&handback);
    if (!bVar5) goto LAB_0011e693;
    pTVar15 = GetTestState((SSL *)local_110._M_impl._0_8_);
    bVar5 = TestState::Serialize(pTVar15,(CBB *)&handback);
    if (!bVar5) goto LAB_0011e693;
    puVar12 = CBB_data((CBB *)&handback);
    puVar16 = CBB_data((CBB *)&handback);
    sVar13 = CBB_len((CBB *)&handback);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&handshaker_input,puVar12,
               puVar16 + sVar13);
    bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&handback);
    pBVar9 = SSL_get_rbio((SSL *)(ssl->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    puVar4 = handshaker_input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    in = handshaker_input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    iVar7 = pipe(rfd);
    if (iVar7 == 0) {
      rfd0_closer.fd_ = rfd[0];
      rfd1_closer.fd_ = rfd[1];
      iVar7 = pipe(wfd);
      if (iVar7 == 0) {
        handshaker.pid_ = -1;
        control.fd_ = -1;
        wfd0_closer.fd_ = wfd[0];
        wfd1_closer.fd_ = wfd[1];
        output.data = (uint8_t *)CONCAT44(rfd[0],4);
        output.len = CONCAT44(wfd[1],5);
        __l._M_len = 2;
        __l._M_array = (iterator)&output;
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   &local_110,__l,(less<int> *)&ssl_handback,(allocator_type *)&proxy_data);
        handback.data._0_4_ = rfd[1];
        handback.data._4_4_ = wfd[0];
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)&handback;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_c8,__l_00,
                   (allocator_type *)&local_220);
        bVar5 = StartHandshaker(&handshaker,&control,config,is_resume,
                                (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                 *)&local_110,(vector<int,_std::allocator<int>_> *)&local_c8);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree(&local_110);
        if (bVar5) {
          ScopedFD::Reset(&rfd0_closer,-1);
          ScopedFD::Reset(&wfd1_closer,-1);
          sVar17 = write_eintr(control.fd_,in,(long)puVar4 - (long)in);
          fd = control;
          if (sVar17 != -1) {
            local_25d = config->async;
            local_1f4 = rfd[1];
            local_1d8 = (pointer)(1L << ((byte)wfd[0] & 0x3f));
            local_1e0 = (pointer)(long)(control.fd_ / 0x40);
            local_1e8 = 1L << ((byte)control.fd_ & 0x3f);
            SVar19 = control;
            if (control.fd_ < wfd[0]) {
              SVar19.fd_ = wfd[0];
            }
            local_220 = pBVar9;
            do {
              do {
                while( true ) {
                  for (lVar18 = 0; lVar18 != 0x10; lVar18 = lVar18 + 1) {
                    (&output.data)[lVar18] = (uint8_t *)0x0;
                  }
                  (&output.data)[wfd[0] / 0x40] =
                       (uint8_t *)((ulong)(&output.data)[wfd[0] / 0x40] | (ulong)local_1d8);
                  (&output.data)[(long)local_1e0] =
                       (uint8_t *)((ulong)(&output.data)[(long)local_1e0] | local_1e8);
                  iVar7 = select(SVar19.fd_ + 1,(fd_set *)&output,(fd_set *)0x0,(fd_set *)0x0,
                                 (timeval *)0x0);
                  if (iVar7 == -1) {
                    pcVar20 = "select";
                    goto LAB_0011eb15;
                  }
                  if ((((ulong)(&output.data)[wfd[0] / 0x40] & (ulong)local_1d8) == 0) ||
                     (sVar17 = read_eintr(wfd[0],&handback,0x40), sVar17 < 1)) break;
                  data = &handback;
                  while (sVar17 != 0) {
                    uVar8 = BIO_write(local_220,data,(int)sVar17);
                    if (uVar8 == 0) {
                      pcVar20 = "BIO_write wrote nothing\n";
                      sStack_270 = 0x18;
                      goto LAB_0011e770;
                    }
                    if ((int)uVar8 < 0) {
                      if (local_25d != true) {
                        pcVar20 = "BIO_write failed\n";
                        sStack_270 = 0x11;
                        goto LAB_0011e770;
                      }
                      AsyncBioAllowWrite((BIO *)local_220,1);
                    }
                    else {
                      data = (CBS *)((long)&data->data + (ulong)uVar8);
                      sVar17 = sVar17 - (ulong)uVar8;
                    }
                  }
                }
              } while (((ulong)(&output.data)[(long)local_1e0] & local_1e8) == 0);
              sVar17 = read_eintr(fd.fd_,&msg,1);
              if (sVar17 != 1) {
                pcVar20 = "read";
                goto LAB_0011eb15;
              }
              if (msg != 'R') {
                if (msg == 'E') {
                  bVar5 = false;
                }
                else if (msg == 'H') {
                  bVar5 = true;
                }
                else {
                  bVar5 = false;
                  fprintf(_stderr,"Unknown control message from handshaker: %c\n",
                          (ulong)(uint)(int)msg);
                }
                goto LAB_0011e780;
              }
              proxy_data.async = &local_25d;
              proxy_data.socket = (BIO **)&local_220;
              proxy_data.rfd = &local_1f4;
              bVar5 = Proxy::anon_class_24_3_c17cc0e2::operator()(&proxy_data,header,5);
              if (!bVar5) goto LAB_0011e779;
              if (header[1] != '\x03') {
                pcVar20 = "bad header\n";
                sStack_270 = 0xb;
LAB_0011e770:
                fwrite(pcVar20,sStack_270,1,_stderr);
                goto LAB_0011e779;
              }
              uVar21 = (ulong)(ushort)(header._3_2_ << 8 | (ushort)header._3_2_ >> 8);
              while (uVar21 != 0) {
                sVar13 = 0x40;
                if (uVar21 < 0x40) {
                  sVar13 = uVar21;
                }
                bVar5 = Proxy::anon_class_24_3_c17cc0e2::operator()
                                  (&proxy_data,(uint8_t *)&ssl_handback,sVar13);
                uVar21 = uVar21 - sVar13;
                if (!bVar5) goto LAB_0011e779;
              }
              msg = 'W';
              sVar17 = write_eintr(fd.fd_,&msg,1);
            } while (sVar17 == 1);
            pcVar20 = "write";
LAB_0011eb15:
            perror(pcVar20);
LAB_0011e779:
            bVar5 = false;
LAB_0011e780:
            bVar6 = ScopedProcess::Wait(&handshaker,(int *)&handback);
            if (bVar6) {
              if ((bool)((int)handback.data != 0 & bVar5)) {
                fwrite("handshaker exited irregularly\n",0x1e,1,_stderr);
              }
              else if (bVar5) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&output,0x100000
                           ,(allocator_type *)&ssl_handback);
                __new_size = read_eintr(control.fd_,output.data,output.len - (long)output.data);
                bVar5 = __new_size != 0xffffffffffffffff;
                if (__new_size == 0xffffffffffffffff) {
                  perror("read");
                }
                else {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&output,
                             __new_size);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                            (&out,&output);
                }
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&output);
                goto LAB_0011e86f;
              }
            }
            else {
              perror("waitpid");
            }
            goto LAB_0011e86d;
          }
          perror("write");
          bVar5 = false;
        }
        else {
LAB_0011e86d:
          bVar5 = false;
        }
LAB_0011e86f:
        ScopedFD::~ScopedFD(&control);
        ScopedProcess::~ScopedProcess(&handshaker);
        ScopedFD::~ScopedFD(&wfd1_closer);
        ScopedFD::~ScopedFD(&wfd0_closer);
        ScopedFD::~ScopedFD(&rfd1_closer);
        ScopedFD::~ScopedFD(&rfd0_closer);
        if (bVar5) {
          pSVar14 = (SSL_CTX *)
                    SSL_get_SSL_CTX((SSL *)(ssl->_M_t).
                                           super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
          local_1d0._M_t.super__Tuple_impl<0UL,_TestState_*,_std::default_delete<TestState>_>.
          super__Head_base<0UL,_TestState_*,_false>._M_head_impl =
               (tuple<TestState_*,_std::default_delete<TestState>_>)
               (_Tuple_impl<0UL,_TestState_*,_std::default_delete<TestState>_>)0x0;
          TestConfig::NewSSL((TestConfig *)&ssl_handback,(SSL_CTX *)config,(SSL_SESSION *)pSVar14,
                             (unique_ptr<TestState,_std::default_delete<TestState>_> *)0x0);
          std::unique_ptr<TestState,_std::default_delete<TestState>_>::~unique_ptr
                    ((unique_ptr<TestState,_std::default_delete<TestState>_> *)&local_1d0);
          if ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
              ssl_handback._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0) {
LAB_0011eab0:
            bVar5 = false;
          }
          else {
            sVar13 = (long)out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start;
            output.data = out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            output.len = sVar13;
            iVar7 = CBS_get_u24_length_prefixed(&output,&handback);
            if ((iVar7 == 0) ||
               (bVar5 = DeserializeContextState(&output,pSVar14), UVar3 = ssl_handback, !bVar5)) {
LAB_0011ea94:
              fwrite("Handback failed.\n",0x11,1,_stderr);
              goto LAB_0011eab0;
            }
            TestState::Deserialize((TestState *)local_228,&output,pSVar14);
            bVar5 = SetTestState((SSL *)UVar3._M_t.
                                        super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                                 (unique_ptr<TestState,_std::default_delete<TestState>_> *)local_228
                                );
            if ((!bVar5) ||
               ((pTVar15 = GetTestState((SSL *)ssl_handback._M_t.
                                               super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl)
                , pTVar15 == (TestState *)0x0 ||
                (handback_00.data_._4_4_ = handback.data._4_4_,
                handback_00.data_._0_4_ = (int)handback.data, handback_00.size_ = handback.len,
                bVar5 = SettingsWriter::WriteHandback
                                  ((SettingsWriter *)local_1f0._M_head_impl,handback_00), !bVar5))))
            {
              std::unique_ptr<TestState,_std::default_delete<TestState>_>::~unique_ptr
                        ((unique_ptr<TestState,_std::default_delete<TestState>_> *)local_228);
              goto LAB_0011ea94;
            }
            handback_01.size_ = sVar13;
            handback_01.data_ = (uchar *)handback.len;
            bVar5 = bssl::SSL_apply_handback
                              ((bssl *)ssl_handback._M_t.
                                       super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                               (SSL *)CONCAT44(handback.data._4_4_,(int)handback.data),handback_01);
            std::unique_ptr<TestState,_std::default_delete<TestState>_>::~unique_ptr
                      ((unique_ptr<TestState,_std::default_delete<TestState>_> *)local_228);
            UVar3 = ssl_handback;
            if (!bVar5) goto LAB_0011ea94;
            pSVar1 = (SSL *)(ssl->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl;
            pBVar9 = SSL_get_rbio(pSVar1);
            BIO_up_ref((BIO *)pBVar9);
            SSL_set0_rbio((SSL *)UVar3._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(BIO *)pBVar9);
            pBVar9 = SSL_get_wbio(pSVar1);
            BIO_up_ref((BIO *)pBVar9);
            SSL_set0_wbio((SSL *)UVar3._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(BIO *)pBVar9);
            SSL_set0_rbio((SSL *)pSVar1,(BIO *)0x0);
            SSL_set0_wbio((SSL *)pSVar1,(BIO *)0x0);
            pTVar15 = GetTestState((ssl->_M_t).
                                   super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
            pBVar2 = pTVar15->async_bio;
            pTVar15 = GetTestState((SSL *)ssl_handback._M_t.
                                          super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
            pTVar15->async_bio = pBVar2;
            pTVar15 = GetTestState((ssl->_M_t).
                                   super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
            UVar3 = ssl_handback;
            pTVar15->async_bio = (BIO *)0x0;
            ssl_handback._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
                 (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
            std::__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)ssl,
                       (pointer)UVar3._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
            bVar5 = true;
          }
          std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&ssl_handback);
          goto LAB_0011eabf;
        }
      }
      else {
        perror("pipe");
        ScopedFD::~ScopedFD(&rfd1_closer);
        ScopedFD::~ScopedFD(&rfd0_closer);
      }
    }
    else {
      perror("pipe");
    }
  }
LAB_0011e6bc:
  fwrite("Handoff failed.\n",0x10,1,_stderr);
  bVar5 = false;
LAB_0011eabf:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&handshaker_input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar5;
}

Assistant:

bool DoSplitHandshake(UniquePtr<SSL> *ssl, SettingsWriter *writer,
                      bool is_resume) {
  assert(SSL_get_rbio(ssl->get()) == SSL_get_wbio(ssl->get()));
  std::vector<uint8_t> handshaker_input;
  const TestConfig *config = GetTestConfig(ssl->get());
  // out is the response from the handshaker, which includes a serialized
  // handback message, but also serialized updates to the |TestState|.
  std::vector<uint8_t> out;
  if (!PrepareHandoff(ssl->get(), writer, &handshaker_input) ||
      !RunHandshaker(SSL_get_rbio(ssl->get()), config, is_resume,
                     handshaker_input, &out)) {
    fprintf(stderr, "Handoff failed.\n");
    return false;
  }

  SSL_CTX *ctx = SSL_get_SSL_CTX(ssl->get());
  UniquePtr<SSL> ssl_handback = config->NewSSL(ctx, nullptr, nullptr);
  if (!ssl_handback) {
    return false;
  }
  CBS output, handback;
  CBS_init(&output, out.data(), out.size());
  if (!CBS_get_u24_length_prefixed(&output, &handback) ||
      !DeserializeContextState(&output, ctx) ||
      !SetTestState(ssl_handback.get(), TestState::Deserialize(&output, ctx)) ||
      !GetTestState(ssl_handback.get()) || !writer->WriteHandback(handback) ||
      !SSL_apply_handback(ssl_handback.get(), handback)) {
    fprintf(stderr, "Handback failed.\n");
    return false;
  }
  MoveBIOs(ssl_handback.get(), ssl->get());
  GetTestState(ssl_handback.get())->async_bio =
      GetTestState(ssl->get())->async_bio;
  GetTestState(ssl->get())->async_bio = nullptr;

  *ssl = std::move(ssl_handback);
  return true;
}